

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_token_t *
gs_token_string(gs_token_t *__return_storage_ptr__,char *text,int *len,int line,int col)

{
  char *pcVar1;
  bool bVar2;
  int local_2c;
  int i;
  char *string;
  int col_local;
  int line_local;
  int *len_local;
  char *text_local;
  
  *len = 1;
  while( true ) {
    bVar2 = false;
    if (text[*len] != '\0') {
      bVar2 = text[*len] != '\"';
    }
    if (!bVar2) break;
    *len = *len + 1;
  }
  pcVar1 = (char *)golf_alloc_tracked((long)*len,"script/parser");
  for (local_2c = 1; local_2c < *len; local_2c = local_2c + 1) {
    pcVar1[local_2c + -1] = text[local_2c];
  }
  pcVar1[*len + -1] = '\0';
  if (text[*len] == '\"') {
    *len = *len + 1;
  }
  __return_storage_ptr__->type = GS_TOKEN_STRING;
  (__return_storage_ptr__->field_3).symbol = pcVar1;
  __return_storage_ptr__->line = line;
  __return_storage_ptr__->col = col;
  return __return_storage_ptr__;
}

Assistant:

static gs_token_t gs_token_string(const char *text, int *len, int line, int col) {
    *len = 1;
    while (text[*len] && text[*len] != '"') {
        (*len)++;
    }

    char *string = golf_alloc_tracked((*len), "script/parser");
    for (int i = 1; i < *len; i++) {
        string[i - 1] = text[i];
    }
    string[(*len) - 1] = 0;

    if (text[*len] == '"') {
        (*len)++;
    }

    gs_token_t token;
    token.type = GS_TOKEN_STRING;
    token.string = string;
    token.line = line;
    token.col = col;
    return token;
}